

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O3

void __thiscall OrgData::PlayData(OrgData *this)

{
  byte key;
  int iVar1;
  long lVar2;
  NOTELIST *pNVar3;
  int i;
  long lVar4;
  OrgData *pOVar5;
  char track;
  long lVar6;
  int *piVar7;
  TRACKDATA *pTVar8;
  
  iVar1 = Volume + -2;
  if (Volume == 0 || !bFadeout) {
    iVar1 = Volume;
  }
  if ((!(bool)(~(Volume != 0 && bFadeout) & -1 < iVar1)) && (Volume = 0, 0 < iVar1)) {
    Volume = iVar1;
  }
  pTVar8 = (this->info).tdata;
  piVar7 = TrackVol;
  lVar4 = 0;
  lVar6 = 0;
  pOVar5 = this;
  do {
    lVar2 = *(long *)((long)np + lVar4);
    track = (char)lVar6;
    if ((lVar2 != 0) && (PlayPos == *(long *)(lVar2 + 0x10))) {
      if ((g_mute[lVar6] == false) && (key = *(byte *)(lVar2 + 0x19), key != 0xff)) {
        pOVar5 = (OrgData *)(ulong)key;
        PlayOrganObject(key,-1,track,(ulong)pTVar8->freq);
        lVar2 = *(long *)((long)np + lVar4);
        *(ulong *)((long)now_leng + lVar4) = (ulong)*(byte *)(lVar2 + 0x18);
      }
      if (*(uchar *)(lVar2 + 0x1b) != 0xff) {
        pOVar5 = (OrgData *)0x0;
        ChangeOrganPan('\0',*(uchar *)(lVar2 + 0x1b),track);
        lVar2 = *(long *)((long)np + lVar4);
      }
      if (*(byte *)(lVar2 + 0x1a) != 0xff) {
        *piVar7 = (uint)*(byte *)(lVar2 + 0x1a);
      }
      *(undefined8 *)((long)np + lVar4) = *(undefined8 *)(lVar2 + 8);
    }
    lVar2 = *(long *)((long)now_leng + lVar4);
    if (lVar2 == 0) {
      pOVar5 = (OrgData *)0x0;
      PlayOrganObject('\0',2,track,(ulong)pTVar8->freq);
      lVar2 = *(long *)((long)now_leng + lVar4);
    }
    if (0 < lVar2) {
      *(long *)((long)now_leng + lVar4) = lVar2 + -1;
    }
    if (*(long *)((long)np + lVar4) != 0) {
      ChangeOrganVolume((int)pOVar5,(long)((Volume * *piVar7) / 0x7f),track);
    }
    lVar6 = lVar6 + 1;
    piVar7 = (int *)((uint *)piVar7 + 1);
    pTVar8 = pTVar8 + 1;
    lVar4 = lVar4 + 8;
  } while (lVar6 != 8);
  lVar4 = 0;
  do {
    pNVar3 = np[lVar4 + 8];
    if (pNVar3 != (NOTELIST *)0x0) {
      if (PlayPos == pNVar3->x) {
        if ((pNVar3->y != 0xff) && (g_mute[lVar4 + 8] == false)) {
          PlayDramObject(pNVar3->y,1,(char)lVar4);
          pNVar3 = np[lVar4 + 8];
        }
        if (pNVar3->pan != 0xff) {
          ChangeDramPan(pNVar3->pan,(char)lVar4);
          pNVar3 = np[lVar4 + 8];
        }
        if (pNVar3->volume != 0xff) {
          TrackVol[lVar4 + 8] = (uint)pNVar3->volume;
        }
        pNVar3 = pNVar3->to;
        np[lVar4 + 8] = pNVar3;
        if (pNVar3 == (NOTELIST *)0x0) goto LAB_001137ef;
      }
      if (audio_backend_initialised == true) {
        AudioBackend_SetSoundVolume
                  (lpSECONDARYBUFFER[lVar4 + 0x96],
                   (long)((Volume * TrackVol[lVar4 + 8]) / 0x7f) * 8 + -0x7f8);
      }
    }
LAB_001137ef:
    lVar4 = lVar4 + 1;
    if (lVar4 == 8) {
      PlayPos = PlayPos + 1;
      if ((this->info).end_x <= PlayPos) {
        PlayPos = (this->info).repeat_x;
        lVar4 = 0;
        do {
          for (pNVar3 = (this->info).tdata[lVar4].note_list;
              (np[lVar4] = pNVar3, pNVar3 != (NOTELIST *)0x0 && (pNVar3->x < PlayPos));
              pNVar3 = pNVar3->to) {
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
      }
      return;
    }
  } while( true );
}

Assistant:

void OrgData::PlayData(void)
{
	int i;

	// Handle fading out
	if (bFadeout && Volume)
		Volume -= 2;
	if (Volume < 0)
		Volume = 0;

	// メロディの再生 (Play melody)
	for (i = 0; i < MAXMELODY; i++)
	{
		if (np[i] != NULL && PlayPos == np[i]->x)
		{
			if (!g_mute[i] && np[i]->y != KEYDUMMY)	// 音が来た。 (The sound has come.)
			{
				PlayOrganObject(np[i]->y, -1, i, info.tdata[i].freq);
				now_leng[i] = np[i]->length;
			}

			if (np[i]->pan != PANDUMMY)
				ChangeOrganPan(np[i]->y, np[i]->pan, i);
			if (np[i]->volume != VOLDUMMY)
				TrackVol[i] = np[i]->volume;

			np[i] = np[i]->to;	// 次の音符を指す (Points to the next note)
		}

		if (now_leng[i] == 0)
			PlayOrganObject(0, 2, i, info.tdata[i].freq);

		if (now_leng[i] > 0)
			now_leng[i]--;

		if (np[i])
			ChangeOrganVolume(np[i]->y, TrackVol[i] * Volume / 0x7F, i);
	}

	// ドラムの再生 (Drum playback)
	for (i = MAXMELODY; i < MAXTRACK; i++)
	{
		if (np[i] != NULL && PlayPos == np[i]->x)	// 音が来た。 (The sound has come.)
		{
			if (np[i]->y != KEYDUMMY && !g_mute[i])	// ならす (Tame)
				PlayDramObject(np[i]->y, 1, i - MAXMELODY);

			if (np[i]->pan != PANDUMMY)
				ChangeDramPan(np[i]->pan, i - MAXMELODY);
			if (np[i]->volume != VOLDUMMY)
				TrackVol[i] = np[i]->volume;

			np[i] = np[i]->to;	// 次の音符を指す (Points to the next note)
		}

		if (np[i])
			ChangeDramVolume(TrackVol[i] * Volume / 0x7F, i - MAXMELODY);
	}

	// Looping
	PlayPos++;
	if (PlayPos >= info.end_x)
	{
		PlayPos = info.repeat_x;
		SetPlayPointer(PlayPos);
	}
}